

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer-spec.cc
# Opt level: O0

void __thiscall
wabt::anon_unknown_1::BinaryWriterSpec::WriteActionResultType(BinaryWriterSpec *this,Action *action)

{
  string_view sVar1;
  ActionType AVar2;
  Index IVar3;
  Module *this_00;
  Func *this_01;
  Type type;
  Export *pEVar4;
  Global *pGVar5;
  Global *global;
  uint local_48;
  Index i;
  Index num_results;
  Func *func;
  Export *export_;
  Module *module;
  Action *action_local;
  BinaryWriterSpec *this_local;
  
  this_00 = Script::GetModule(this->script_,&action->module_var);
  Stream::Writef(this->json_stream_,"[");
  AVar2 = Action::type(action);
  if (AVar2 == Invoke) {
    sVar1 = (string_view)
            std::__cxx11::string::operator_cast_to_basic_string_view((string *)&action->name);
    pEVar4 = Module::GetExport(this_00,sVar1);
    if (pEVar4->kind != First) {
      __assert_fail("export_->kind == ExternalKind::Func",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/binary-writer-spec.cc"
                    ,0x16e,
                    "void wabt::(anonymous namespace)::BinaryWriterSpec::WriteActionResultType(const Action &)"
                   );
    }
    this_01 = Module::GetFunc(this_00,&pEVar4->var);
    IVar3 = Func::GetNumResults(this_01);
    for (local_48 = 0; local_48 < IVar3; local_48 = local_48 + 1) {
      type = Func::GetResultType(this_01,local_48);
      WriteTypeObject(this,type);
    }
  }
  else if (AVar2 == Get) {
    sVar1 = (string_view)
            std::__cxx11::string::operator_cast_to_basic_string_view((string *)&action->name);
    pEVar4 = Module::GetExport(this_00,sVar1);
    if (pEVar4->kind != Global) {
      __assert_fail("export_->kind == ExternalKind::Global",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/binary-writer-spec.cc"
                    ,0x178,
                    "void wabt::(anonymous namespace)::BinaryWriterSpec::WriteActionResultType(const Action &)"
                   );
    }
    pGVar5 = Module::GetGlobal(this_00,&pEVar4->var);
    WriteTypeObject(this,pGVar5->type);
  }
  Stream::Writef(this->json_stream_,"]");
  return;
}

Assistant:

void BinaryWriterSpec::WriteActionResultType(const Action& action) {
  const Module* module = script_->GetModule(action.module_var);
  const Export* export_;
  json_stream_->Writef("[");
  switch (action.type()) {
    case ActionType::Invoke: {
      export_ = module->GetExport(action.name);
      assert(export_->kind == ExternalKind::Func);
      const Func* func = module->GetFunc(export_->var);
      Index num_results = func->GetNumResults();
      for (Index i = 0; i < num_results; ++i)
        WriteTypeObject(func->GetResultType(i));
      break;
    }

    case ActionType::Get: {
      export_ = module->GetExport(action.name);
      assert(export_->kind == ExternalKind::Global);
      const Global* global = module->GetGlobal(export_->var);
      WriteTypeObject(global->type);
      break;
    }
  }
  json_stream_->Writef("]");
}